

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fApiCase.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ApiCase::ApiCase
          (ApiCase *this,Context *context,char *name,char *description)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *pTVar3;
  char *description_local;
  char *name_local;
  Context *context_local;
  ApiCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  pRVar2 = Context::getRenderContext(context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  this_00 = Context::getTestContext(context);
  pTVar3 = tcu::TestContext::getLog(this_00);
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0159bf88;
  pTVar3 = glu::CallLogWrapper::getLog(&this->super_CallLogWrapper);
  this->m_log = pTVar3;
  return;
}

Assistant:

ApiCase::ApiCase (Context& context, const char* name, const char* description)
	: TestCase		(context, name, description)
	, CallLogWrapper(context.getRenderContext().getFunctions(), context.getTestContext().getLog())
	, m_log			(getLog())
{
}